

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O0

RGB __thiscall RayTracer::processPixel(RayTracer *this,Segment *ray,int recursionLevel)

{
  bool bVar1;
  RGB RVar2;
  RGB local_74;
  __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> local_70;
  Plane *local_68;
  __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_> local_60;
  Sphere *local_58;
  anon_class_8_1_ba1d738a local_50;
  anon_class_8_1_ba1d738a closerIntersectionCmp;
  undefined1 auStack_40 [4];
  pair<int,_Point> planeIntersection;
  pair<int,_Point> sphereIntersection;
  int recursionLevel_local;
  Segment *ray_local;
  RayTracer *this_local;
  
  join_0x00001200_0x00000000_ =
       findClosestIntersection<Sphere>(&(this->super_RayTracerBase).config.spheres,ray);
  join_0x00001200_0x00000000_ =
       findClosestIntersection<Plane>(&(this->super_RayTracerBase).config.planes,ray);
  if ((planeIntersection.second.y == -NAN) && (closerIntersectionCmp.ray._4_4_ == -1)) {
    RVar2 = processPixelOnBackground(this);
    this_local._5_2_ = RVar2._0_2_;
    this_local._7_1_ = RVar2.b;
  }
  else {
    local_50.ray = ray;
    bVar1 = processPixel::anon_class_8_1_ba1d738a::operator()
                      (&local_50,(pair<int,_Point> *)&planeIntersection.second.y,
                       (pair<int,_Point> *)((long)&closerIntersectionCmp.ray + 4));
    if (bVar1) {
      local_60._M_current =
           (Sphere *)
           std::vector<Sphere,_std::allocator<Sphere>_>::cbegin
                     (&(this->super_RayTracerBase).config.spheres);
      local_58 = (Sphere *)
                 __gnu_cxx::
                 __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
                 operator+(&local_60,(long)(int)planeIntersection.second.y);
      RVar2 = processPixelOnSphere
                        (this,&ray->a,(Point *)&planeIntersection.second.z,(const_iterator)local_58,
                         recursionLevel);
      this_local._5_2_ = RVar2._0_2_;
      this_local._7_1_ = RVar2.b;
    }
    else {
      local_70._M_current =
           (Plane *)std::vector<Plane,_std::allocator<Plane>_>::cbegin
                              (&(this->super_RayTracerBase).config.planes);
      local_68 = (Plane *)__gnu_cxx::
                          __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                          ::operator+(&local_70,(long)closerIntersectionCmp.ray._4_4_);
      RVar2 = processPixelOnPlane(this,&ray->a,(Point *)auStack_40,(const_iterator)local_68,
                                  recursionLevel);
      this_local._5_2_ = RVar2._0_2_;
      this_local._7_1_ = RVar2.b;
    }
  }
  local_74.b = this_local._7_1_;
  local_74.r = this_local._5_1_;
  local_74.g = this_local._6_1_;
  return local_74;
}

Assistant:

RGB RayTracer::processPixel(Segment const& ray, int recursionLevel)
{
  std::pair<int, Point> sphereIntersection = findClosestIntersection(config.spheres, ray);
  std::pair<int, Point> planeIntersection = findClosestIntersection(config.planes, ray);

  if (sphereIntersection.first == -1 && planeIntersection.first == -1)
    return processPixelOnBackground();

  auto closerIntersectionCmp = [&ray](std::pair<int, Point> const& i1,
                                      std::pair<int, Point> const& i2) {
    if (i1.first != -1 && i2.first != -1)
      return distance(ray.a, i1.second) < distance(ray.a, i2.second);
    return i1.first != -1;
  };

  if (closerIntersectionCmp(sphereIntersection, planeIntersection))
    return processPixelOnSphere(ray.a, sphereIntersection.second,
                                config.spheres.cbegin() + sphereIntersection.first, recursionLevel);
  else
    return processPixelOnPlane(ray.a, planeIntersection.second,
                               config.planes.cbegin() + planeIntersection.first, recursionLevel);
}